

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void container_printf(container_t *c,uint8_t type)

{
  array_container_t *v;
  uint8_t local_9;
  
  local_9 = type;
  v = (array_container_t *)container_unwrap_shared(c,&local_9);
  if (local_9 == '\x03') {
    run_container_printf((run_container_t *)v);
    return;
  }
  if (local_9 == '\x02') {
    array_container_printf(v);
    return;
  }
  bitset_container_printf((bitset_container_t *)v);
  return;
}

Assistant:

void container_printf(const container_t *c, uint8_t type) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf(const_CAST_bitset(c));
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf(const_CAST_array(c));
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf(const_CAST_run(c));
            return;
        default:
            __builtin_unreachable();
    }
}